

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::NormalGetRealName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmTarget *pcVar1;
  allocator<char> local_e9;
  string msg;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [7];
  
  pcVar1 = this->Target;
  if (pcVar1->IsImportedTarget == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"NormalGetRealName called on imported target: ",&local_e9);
    std::__cxx11::string::append((string *)&msg);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&msg);
    std::__cxx11::string::~string((string *)&msg);
    pcVar1 = this->Target;
  }
  if (pcVar1->TargetTypeValue == EXECUTABLE) {
    GetExecutableNames((Names *)&msg,this,config);
  }
  else {
    GetLibraryNames((Names *)&msg,this,config);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_p == local_98) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_98[0]._M_allocated_capacity._1_7_,local_98[0]._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_98[0]._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_a8._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_98[0]._M_allocated_capacity._1_7_,local_98[0]._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_a0;
  local_98[0]._M_local_buf[0] = '\0';
  Names::~Names((Names *)&msg);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetRealName(
  const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "NormalGetRealName called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

  if (this->GetType() == cmStateEnums::EXECUTABLE) {
    // Compute the real name that will be built.
    return this->GetExecutableNames(config).Real;
  }
  // Compute the real name that will be built.
  return this->GetLibraryNames(config).Real;
}